

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::textVectors(FastText *this)

{
  bool bVar1;
  int iVar2;
  element_type *A;
  size_type sVar3;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  const_iterator it;
  Vector vec;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  ostream *in_stack_ffffffffffffff68;
  element_type *in_stack_ffffffffffffff70;
  element_type *in_stack_ffffffffffffff80;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_60 [2];
  int32_t in_stack_ffffffffffffffb4;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  Dictionary *in_stack_ffffffffffffffc0;
  vector<int,_std::allocator<int>_> local_20;
  undefined1 auVar5 [64];
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13a196);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13a1a0);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13a1aa);
  Vector::Vector((Vector *)in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68);
  while( true ) {
    iVar2 = std::istream::peek();
    auVar5._8_56_ = extraout_var;
    auVar5._0_8_ = extraout_XMM0_Qa;
    if (iVar2 == -1) break;
    in_stack_ffffffffffffff80 =
         std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x13a1ec);
    std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x13a1ff);
    Dictionary::getLine((Dictionary *)this,
                        (istream *)
                        line.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (vector<int,_std::allocator<int>_> *)
                        line.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,
                        (vector<int,_std::allocator<int>_> *)
                        line.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (minstd_rand *)
                        labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    A = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x13a234);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x13a243);
    Dictionary::addNgrams
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    Vector::zero((Vector *)&stack0xffffffffffffffb8);
    local_60[0]._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::cbegin
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff68);
    while( true ) {
      std::vector<int,_std::allocator<int>_>::cend
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff68);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff70,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff68);
      auVar4 = auVar5._0_16_;
      if (!bVar1) break;
      in_stack_ffffffffffffff70 =
           std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_ffffffffffffff70);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (local_60);
      Vector::addRow((Vector *)in_stack_ffffffffffffff80,(Matrix *)A,
                     (int64_t)in_stack_ffffffffffffff70);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (local_60);
    }
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80);
    if (!bVar1) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_20);
      auVar4 = vcvtusi2sd_avx512f(auVar4,sVar3);
      Vector::mul((Vector *)&stack0xffffffffffffffb8,(float)(1.0 / auVar4._0_8_));
    }
    in_stack_ffffffffffffff68 = operator<<((ostream *)in_stack_ffffffffffffff80,(Vector *)A);
    std::ostream::operator<<(in_stack_ffffffffffffff68,std::endl<char,std::char_traits<char>>);
  }
  Vector::~Vector((Vector *)in_stack_ffffffffffffff70);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void FastText::textVectors() {
  std::vector<int32_t> line, labels;
  Vector vec(args_->dim);
  while (std::cin.peek() != EOF) {
    dict_->getLine(std::cin, line, labels, model_->rng);
    dict_->addNgrams(line, args_->wordNgrams);
    vec.zero();
    for (auto it = line.cbegin(); it != line.cend(); ++it) {
      vec.addRow(*input_, *it);
    }
    if (!line.empty()) {
      vec.mul(1.0 / line.size());
    }
    std::cout << vec << std::endl;
  }
}